

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalCommonGenerator.cxx
# Opt level: O0

void __thiscall cmLocalCommonGenerator::SetConfigName(cmLocalCommonGenerator *this)

{
  cmMakefile *this_00;
  char *pcVar1;
  allocator local_39;
  string local_38;
  char *local_18;
  char *config;
  cmLocalCommonGenerator *this_local;
  
  this_00 = (this->super_cmLocalGenerator).Makefile;
  config = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"CMAKE_BUILD_TYPE",&local_39);
  pcVar1 = cmMakefile::GetDefinition(this_00,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  local_18 = pcVar1;
  if (pcVar1 == (char *)0x0) {
    std::__cxx11::string::operator=((string *)&this->ConfigName,"");
  }
  else {
    std::__cxx11::string::operator=((string *)&this->ConfigName,pcVar1);
  }
  return;
}

Assistant:

void cmLocalCommonGenerator::SetConfigName()
{
  // Store the configuration name that will be generated.
  if(const char* config = this->Makefile->GetDefinition("CMAKE_BUILD_TYPE"))
    {
    // Use the build type given by the user.
    this->ConfigName = config;
    }
  else
    {
    // No configuration type given.
    this->ConfigName = "";
    }
}